

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O3

int nn_rep_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  size_t sVar2;
  
  if (((ulong)self[0x1b].vfptr & 1) == 0) {
    return -0x9523dfe;
  }
  sVar2 = nn_chunkref_size(&msg->sphdr);
  if (sVar2 == 0) {
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_mv(&msg->sphdr,(nn_chunkref *)&self[0x1b].sock);
    *(byte *)&self[0x1b].vfptr = *(byte *)&self[0x1b].vfptr & 0xfe;
    iVar1 = nn_xrep_send(self,msg);
    if (iVar1 == -0xb) {
      return 0;
    }
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    nn_rep_send_cold_1();
  }
  nn_rep_send_cold_2();
}

Assistant:

int nn_rep_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_rep *rep;

    rep = nn_cont (self, struct nn_rep, xrep.sockbase);

    /*  If no request was received, there's nowhere to send the reply to. */
    if (nn_slow (!(rep->flags & NN_REP_INPROGRESS)))
        return -EFSM;

    /*  Move the stored backtrace into the message header. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &rep->backtrace);
    rep->flags &= ~NN_REP_INPROGRESS;

    /*  Send the reply. If it cannot be sent because of pushback,
        drop it silently. */
    rc = nn_xrep_send (&rep->xrep.sockbase, msg);
    errnum_assert (rc == 0 || rc == -EAGAIN, -rc);

    return 0;
}